

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O1

void invokeCallbacksOPTION
               (poptContext con,poptOption *opt,poptOption *myOpt,void *myData,int shorty)

{
  poptOption *opt_00;
  int iVar1;
  char *pcVar2;
  uint uVar3;
  poptOption *ppVar4;
  poptOption *ppVar5;
  char *pcVar6;
  byte bVar7;
  
  if (opt != (poptOption *)0x0) {
    ppVar5 = (poptOption *)0x0;
    ppVar4 = (poptOption *)0x0;
    do {
      pcVar6 = opt->longName;
      if (((pcVar6 == (char *)0x0) && (opt->shortName == '\0')) && (opt->arg == (void *)0x0)) {
        return;
      }
      opt_00 = (poptOption *)opt->arg;
      uVar3 = _poptArgMask & opt->argInfo;
      if (uVar3 == 5) {
        if ((opt->argInfo >> 0x1c & 1) == 0) {
          ppVar4 = opt_00;
          ppVar5 = opt;
        }
        bVar7 = 1;
      }
      else {
        bVar7 = 1;
        if (uVar3 == 4) {
          if (opt_00 != (poptOption *)0x0) {
            invokeCallbacksOPTION(con,opt_00,myOpt,myData,shorty);
          }
        }
        else if (((ppVar5 != (poptOption *)0x0) && (ppVar4 != (poptOption *)0x0)) &&
                (((myOpt->shortName != '\0' &&
                  ((shorty != 0 && (myOpt->shortName == opt->shortName)))) ||
                 ((myOpt->longName != (char *)0x0 && pcVar6 != (char *)0x0 &&
                  (iVar1 = strcmp(myOpt->longName,pcVar6), iVar1 == 0)))))) {
          pcVar6 = (char *)myData;
          if (ppVar5->descrip != (char *)0x0) {
            pcVar6 = ppVar5->descrip;
          }
          if (myOpt->argInfo == 0) {
            pcVar2 = (char *)0x0;
          }
          else {
            pcVar2 = con->os->nextArg;
          }
          (*(code *)ppVar4)(con,2,myOpt,pcVar2,pcVar6);
          bVar7 = (*(byte *)((long)&ppVar5->argInfo + 3) & 8) >> 3;
        }
      }
      opt = opt + 1;
    } while (bVar7 != 0);
  }
  return;
}

Assistant:

static void invokeCallbacksOPTION(poptContext con,
				const struct poptOption * opt,
				const struct poptOption * myOpt,
				const void * myData, int shorty)
{
    const struct poptOption * cbopt = NULL;
    poptArg cbarg = { .ptr = NULL };

    if (opt != NULL)
    for (; opt->longName || opt->shortName || opt->arg; opt++) {
	poptArg arg = { .ptr = opt->arg };
	switch (poptArgType(opt)) {
	case POPT_ARG_INCLUDE_TABLE:	/* Recurse on included sub-tables. */
	    poptSubstituteHelpI18N(arg.opt);	/* XXX side effects */
	    if (opt->arg != NULL)
		invokeCallbacksOPTION(con, opt->arg, myOpt, myData, shorty);
	    break;
	case POPT_ARG_CALLBACK:		/* Save callback info. */
	    if (CBF_ISSET(opt, SKIPOPTION))
		break;
	    cbopt = opt;
	    cbarg.ptr = opt->arg;
	    break;
	default:		/* Perform callback on matching option. */
	    if (cbopt == NULL || cbarg.cb == NULL)
		break;
	    if ((myOpt->shortName && opt->shortName && shorty &&
			myOpt->shortName == opt->shortName)
	     || (myOpt->longName != NULL && opt->longName != NULL &&
			!strcmp(myOpt->longName, opt->longName)))
	    {	const void *cbData = (cbopt->descrip ? cbopt->descrip : myData);
		cbarg.cb(con, POPT_CALLBACK_REASON_OPTION,
			myOpt, myOpt->argInfo ? con->os->nextArg : NULL, cbData);
		/* Terminate (unless explicitly continuing). */
		if (!CBF_ISSET(cbopt, CONTINUE))
		    return;
	    }
	    break;
	}
    }
}